

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O1

MessageBase * __thiscall MessageQueue::PopAndWait(MessageQueue *this)

{
  uint uVar1;
  MessageBase *pMVar2;
  DListNode<MessageQueue::ListEntry> *pDVar3;
  DWORD DVar4;
  MessageBase *extraout_RAX;
  DListNode<MessageQueue::ListEntry> **ppDVar5;
  DListNode<MessageQueue::ListEntry> *node;
  
  node = (this->m_queue).head;
  if (node != (DListNode<MessageQueue::ListEntry> *)0x0) {
    pMVar2 = (node->data).message;
    SortedList<MessageQueue::ListEntry>::Remove(&this->m_queue,node);
    uVar1 = pMVar2->m_time;
    DVar4 = GetTickCount();
    DVar4 = uVar1 - DVar4;
    if (0 < (int)DVar4) {
      Sleep(DVar4);
    }
    return pMVar2;
  }
  PopAndWait();
  pDVar3 = node->prev;
  ppDVar5 = &pDVar3->next;
  if (pDVar3 == (DListNode<MessageQueue::ListEntry> *)0x0) {
    ppDVar5 = (DListNode<MessageQueue::ListEntry> **)this;
  }
  *ppDVar5 = node->next;
  if (node->next != (DListNode<MessageQueue::ListEntry> *)0x0) {
    node->next->prev = pDVar3;
  }
  if (node != (DListNode<MessageQueue::ListEntry> *)0x0) {
    operator_delete(node);
    return extraout_RAX;
  }
  return (MessageBase *)pDVar3;
}

Assistant:

MessageBase* PopAndWait()
    {
        Assert(!m_queue.IsEmpty());

        ListEntry entry = m_queue.Pop();
        MessageBase *tmp = entry.message;

        int waitTime = tmp->GetTime() - GetTickCount();
        if(waitTime > 0)
        {
            Sleep(waitTime);
        }

        return tmp;
    }